

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void RAWToYJRow_C(uint8_t *src_argb0,uint8_t *dst_y,int width)

{
  int iVar1;
  int in_EDX;
  undefined1 *in_RSI;
  uint8_t *in_RDI;
  int x;
  int local_18;
  undefined1 *local_10;
  uint8_t *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_18 = 0; local_18 < in_EDX; local_18 = local_18 + 1) {
    iVar1 = libyuv::RGBToYJ(*local_8,local_8[1],local_8[2]);
    *local_10 = (char)iVar1;
    local_8 = local_8 + 3;
    local_10 = local_10 + 1;
  }
  return;
}

Assistant:

void RGB565ToYRow_C(const uint8_t* src_rgb565, uint8_t* dst_y, int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8_t b = src_rgb565[0] & 0x1f;
    uint8_t g = (src_rgb565[0] >> 5) | ((src_rgb565[1] & 0x07) << 3);
    uint8_t r = src_rgb565[1] >> 3;
    b = (b << 3) | (b >> 2);
    g = (g << 2) | (g >> 4);
    r = (r << 3) | (r >> 2);
    dst_y[0] = RGBToY(r, g, b);
    src_rgb565 += 2;
    dst_y += 1;
  }
}